

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void __thiscall
loguru::LogScopeRAII::LogScopeRAII
          (LogScopeRAII *this,Verbosity verbosity,char *file,uint line,char *format,...)

{
  char in_AL;
  bool bVar1;
  Verbosity VVar2;
  longlong lVar3;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [40];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  reference local_88;
  Callback *p;
  iterator __end2;
  iterator __begin2;
  CallbackVec *__range2;
  va_list vlist;
  lock_guard<std::recursive_mutex> local_38;
  lock_guard<std::recursive_mutex> lock;
  char *format_local;
  uint line_local;
  char *file_local;
  Verbosity verbosity_local;
  LogScopeRAII *this_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  this->_verbosity = verbosity;
  this->_file = file;
  this->_line = line;
  local_110 = in_R9;
  lock._M_device = (mutex_type *)format;
  VVar2 = current_verbosity_cutoff();
  if (VVar2 < verbosity) {
    this->_file = (char *)0x0;
  }
  else {
    std::lock_guard<std::recursive_mutex>::lock_guard(&local_38,(mutex_type *)s_mutex);
    this->_indent_stderr = verbosity <= g_stderr_verbosity;
    lVar3 = now_ns();
    this->_start_time_ns = lVar3;
    vlist[0].overflow_arg_area = local_138;
    vlist[0]._0_8_ = &stack0x00000008;
    __range2._4_4_ = 0x30;
    __range2._0_4_ = 0x28;
    vsnprintf(this->_name,0xc4,(char *)lock._M_device,&__range2);
    log_to_everywhere(1,this->_verbosity,file,line,"{ ",this->_name);
    if ((this->_indent_stderr & 1U) != 0) {
      std::__atomic_base<unsigned_int>::operator++
                ((__atomic_base<unsigned_int> *)&s_stderr_indentation);
    }
    __end2 = std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::begin
                       ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
    p = (Callback *)
        std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::end
                  ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                                  *)&p);
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                 ::operator*(&__end2);
      if (verbosity <= local_88->verbosity) {
        local_88->indentation = local_88->indentation + 1;
      }
      __gnu_cxx::
      __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
      ::operator++(&__end2);
    }
    std::lock_guard<std::recursive_mutex>::~lock_guard(&local_38);
  }
  return;
}

Assistant:

LogScopeRAII::LogScopeRAII(Verbosity verbosity, const char* file, unsigned line, const char* format, ...)
		: _verbosity(verbosity), _file(file), _line(line)
	{
		if (verbosity <= current_verbosity_cutoff()) {
			std::lock_guard<std::recursive_mutex> lock(s_mutex);
			_indent_stderr = (verbosity <= g_stderr_verbosity);
			_start_time_ns = now_ns();
			va_list vlist;
			va_start(vlist, format);
			vsnprintf(_name, sizeof(_name), format, vlist);
			log_to_everywhere(1, _verbosity, file, line, "{ ", _name);
			va_end(vlist);

			if (_indent_stderr) {
				++s_stderr_indentation;
			}

			for (auto& p : s_callbacks) {
				if (verbosity <= p.verbosity) {
					++p.indentation;
				}
			}
		} else {
			_file = nullptr;
		}
	}